

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  int iVar5;
  ImGuiWindow *window_00;
  ImGuiInputReadMode rm;
  bool bVar6;
  ImVec2 IVar7;
  byte local_79;
  bool local_78;
  bool local_77;
  bool is_repeating_already;
  bool is_double_click_release;
  bool release_anywhere;
  bool release_in;
  int mouse_button;
  bool local_64;
  int local_60;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool has_repeated_at_least_once;
  int mouse_button_released;
  int mouse_button_clicked;
  float DRAG_DROP_HOLD_TIMER;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  bool *out_held_local;
  bool *out_hovered_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar3 = GImGui;
  window_00 = GetCurrentWindow();
  if ((flags & 0x4000U) == 0) {
    g._4_4_ = flags;
    if ((flags & 7U) == 0) {
      g._4_4_ = flags | 1;
    }
    if ((g._4_4_ & 0x3f0) == 0) {
      g._4_4_ = g._4_4_ | 0x20;
    }
    pIVar2 = pIVar3->HoveredWindow;
    bVar6 = false;
    if ((g._4_4_ & 0x800) != 0) {
      bVar6 = pIVar3->HoveredRootWindow == window_00->RootWindow;
    }
    if (bVar6) {
      pIVar3->HoveredWindow = window_00;
    }
    bb_local._7_1_ = false;
    mouse_button_clicked._1_1_ = ItemHoverable(bb,id);
    if ((((mouse_button_clicked._1_1_) && ((pIVar3->DragDropActive & 1U) != 0)) &&
        ((pIVar3->DragDropPayload).SourceId == id)) && ((pIVar3->DragDropSourceFlags & 2U) == 0)) {
      mouse_button_clicked._1_1_ = false;
    }
    if ((((pIVar3->DragDropActive & 1U) != 0) && ((g._4_4_ & 0x200) != 0)) &&
       (((pIVar3->DragDropSourceFlags & 4U) == 0 && (bVar4 = IsItemHovered(0x20), bVar4)))) {
      mouse_button_clicked._1_1_ = true;
      SetHoveredID(id);
      iVar5 = CalcTypematicRepeatAmount
                        ((pIVar3->HoveredIdTimer + 0.0001) - (pIVar3->IO).DeltaTime,
                         pIVar3->HoveredIdTimer + 0.0001,0.7,0.0);
      bb_local._7_1_ = iVar5 != 0;
      if (bb_local._7_1_) {
        pIVar3->DragDropHoldJustPressedId = id;
        FocusWindow(window_00);
      }
    }
    if (bVar6) {
      pIVar3->HoveredWindow = pIVar2;
    }
    if (((mouse_button_clicked._1_1_ != false) && ((g._4_4_ & 0x1000) != 0)) &&
       ((pIVar3->HoveredIdPreviousFrame != id && (pIVar3->HoveredIdPreviousFrame != 0)))) {
      mouse_button_clicked._1_1_ = false;
    }
    if (mouse_button_clicked._1_1_ != false) {
      if (((g._4_4_ & 0x10000) == 0) ||
         (((((pIVar3->IO).KeyCtrl & 1U) == 0 && (((pIVar3->IO).KeyShift & 1U) == 0)) &&
          (((pIVar3->IO).KeyAlt & 1U) == 0)))) {
        _held = -1;
        local_60 = -1;
        if (((g._4_4_ & 1) == 0) || (((pIVar3->IO).MouseClicked[0] & 1U) == 0)) {
          if (((g._4_4_ & 2) == 0) || (((pIVar3->IO).MouseClicked[1] & 1U) == 0)) {
            if (((g._4_4_ & 4) != 0) && (((pIVar3->IO).MouseClicked[2] & 1U) != 0)) {
              _held = 2;
            }
          }
          else {
            _held = 1;
          }
        }
        else {
          _held = 0;
        }
        if (((g._4_4_ & 1) == 0) || (((pIVar3->IO).MouseReleased[0] & 1U) == 0)) {
          if (((g._4_4_ & 2) == 0) || (((pIVar3->IO).MouseReleased[1] & 1U) == 0)) {
            if (((g._4_4_ & 4) != 0) && (((pIVar3->IO).MouseReleased[2] & 1U) != 0)) {
              local_60 = 2;
            }
          }
          else {
            local_60 = 1;
          }
        }
        else {
          local_60 = 0;
        }
        if ((_held != -1) && (pIVar3->ActiveId != id)) {
          if ((g._4_4_ & 0x60) != 0) {
            SetActiveID(id,window_00);
            pIVar3->ActiveIdMouseButton = _held;
            if ((g._4_4_ & 0x40000) == 0) {
              SetFocusID(id,window_00);
            }
            FocusWindow(window_00);
          }
          if (((g._4_4_ & 0x10) != 0) ||
             (((g._4_4_ & 0x100) != 0 && (((pIVar3->IO).MouseDoubleClicked[_held] & 1U) != 0)))) {
            bb_local._7_1_ = true;
            if ((g._4_4_ & 0x20000) == 0) {
              SetActiveID(id,window_00);
            }
            else {
              ClearActiveID();
            }
            pIVar3->ActiveIdMouseButton = _held;
            FocusWindow(window_00);
          }
        }
        if (((g._4_4_ & 0x80) != 0) && (local_60 != -1)) {
          bVar6 = false;
          if ((g._4_4_ & 0x400) != 0) {
            bVar6 = (pIVar3->IO).KeyRepeatDelay <= (pIVar3->IO).MouseDownDurationPrev[local_60];
          }
          if (!bVar6) {
            bb_local._7_1_ = true;
          }
          ClearActiveID();
        }
        if ((((pIVar3->ActiveId == id) && ((g._4_4_ & 0x400) != 0)) &&
            (0.0 < (pIVar3->IO).MouseDownDuration[pIVar3->ActiveIdMouseButton])) &&
           (bVar6 = IsMouseClicked(pIVar3->ActiveIdMouseButton,true), bVar6)) {
          bb_local._7_1_ = true;
        }
      }
      if (bb_local._7_1_ != false) {
        pIVar3->NavDisableHighlight = true;
      }
    }
    if (((((pIVar3->NavId == id) && ((pIVar3->NavDisableHighlight & 1U) == 0)) &&
         ((pIVar3->NavDisableMouseHover & 1U) != 0)) &&
        (((pIVar3->ActiveId == 0 || (pIVar3->ActiveId == id)) ||
         (pIVar3->ActiveId == window_00->MoveId)))) && ((g._4_4_ & 0x80000) == 0)) {
      mouse_button_clicked._1_1_ = true;
    }
    if (pIVar3->NavActivateDownId == id) {
      bVar6 = pIVar3->NavActivateId == id;
      rm = ImGuiInputReadMode_Pressed;
      if ((g._4_4_ & 0x400) != 0) {
        rm = ImGuiInputReadMode_Repeat;
      }
      bVar4 = IsNavInputTest(0,rm);
      if ((bVar6) || (bVar4)) {
        bb_local._7_1_ = true;
      }
      if (((bVar6) || (bVar4)) || (pIVar3->ActiveId == id)) {
        pIVar3->NavActivateId = id;
        SetActiveID(id,window_00);
        if (((bVar6) || (bVar4)) && ((g._4_4_ & 0x40000) == 0)) {
          SetFocusID(id,window_00);
        }
      }
    }
    local_64 = false;
    if (pIVar3->ActiveId == id) {
      if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
          IVar7 = operator-(&(pIVar3->IO).MousePos,&bb->Min);
          pIVar3->ActiveIdClickOffset = IVar7;
        }
        uVar1 = pIVar3->ActiveIdMouseButton;
        local_77 = 4 < uVar1;
        if (local_77) {
          __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x26a,
                        "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                       );
        }
        if (((pIVar3->IO).MouseDown[(int)uVar1] & 1U) == 0) {
          local_78 = mouse_button_clicked._1_1_ != false && (g._4_4_ & 0x20) != 0;
          if (((local_78) || ((g._4_4_ & 0x40) != 0)) && ((pIVar3->DragDropActive & 1U) == 0)) {
            local_79 = 0;
            if ((g._4_4_ & 0x100) != 0) {
              local_79 = (pIVar3->IO).MouseDownWasDoubleClick[(int)uVar1];
            }
            bVar6 = false;
            if ((g._4_4_ & 0x400) != 0) {
              bVar6 = (pIVar3->IO).KeyRepeatDelay <= (pIVar3->IO).MouseDownDurationPrev[(int)uVar1];
            }
            if (((local_79 & 1) == 0) && (!bVar6)) {
              bb_local._7_1_ = true;
            }
          }
          ClearActiveID();
        }
        else {
          local_64 = true;
        }
        if ((g._4_4_ & 0x40000) == 0) {
          pIVar3->NavDisableHighlight = true;
        }
      }
      else if ((pIVar3->ActiveIdSource == ImGuiInputSource_Nav) && (pIVar3->NavActivateDownId != id)
              ) {
        ClearActiveID();
      }
      if (bb_local._7_1_ != false) {
        pIVar3->ActiveIdHasBeenPressedBefore = true;
      }
    }
    if (out_hovered != (bool *)0x0) {
      *out_hovered = mouse_button_clicked._1_1_;
    }
    if (out_held != (bool *)0x0) {
      *out_held = local_64;
    }
  }
  else {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar3->ActiveId == id) {
      ClearActiveID();
    }
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window->RootWindow;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            const float DRAG_DROP_HOLD_TIMER = 0.70f;
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, DRAG_DROP_HOLD_TIMER, 0.00f))
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[mouse_button_clicked]))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[mouse_button];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}